

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# virtual_machine.cpp
# Opt level: O0

void __thiscall
defyx::VmBase<defyx::LargePageAllocator,_true>::~VmBase
          (VmBase<defyx::LargePageAllocator,_true> *this)

{
  undefined8 *in_RDI;
  size_t in_stack_ffffffffffffffe8;
  
  *in_RDI = &PTR__VmBase_00168a00;
  LargePageAllocator::freeMemory(in_RDI,in_stack_ffffffffffffffe8);
  defyx_vm::~defyx_vm((defyx_vm *)0x12751e);
  return;
}

Assistant:

VmBase<Allocator, softAes>::~VmBase() {
		Allocator::freeMemory(scratchpad, ScratchpadSize);
	}